

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_gcn_shader_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  allocator local_89;
  undefined1 local_88 [8];
  string expr;
  AMDGCNShader op;
  allocator local_51;
  string local_50;
  uint32_t local_2c;
  uint32_t *puStack_28;
  uint32_t param_6_local;
  uint32_t *args_local;
  uint32_t local_18;
  uint32_t eop_local;
  uint32_t id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_2c = param_5;
  puStack_28 = args;
  args_local._4_4_ = eop;
  local_18 = id;
  eop_local = result_type;
  _id_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_50,"GL_AMD_gcn_shader",&local_51);
  require_extension_internal(this,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  expr.field_2._8_4_ = args_local._4_4_;
  if (args_local._4_4_ == 1) {
    emit_unary_func_op(this,eop_local,local_18,*puStack_28,"cubeFaceIndexAMD");
  }
  else if (args_local._4_4_ == 2) {
    emit_unary_func_op(this,eop_local,local_18,*puStack_28,"cubeFaceCoordAMD");
  }
  else if (args_local._4_4_ == 3) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)local_88,"timeAMD()",&local_89);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_89);
    emit_op(this,eop_local,local_18,(string *)local_88,true,false);
    register_control_dependent_expression(this,local_18);
    ::std::__cxx11::string::~string((string *)local_88);
  }
  else {
    statement<char_const(&)[40],unsigned_int&>
              (this,(char (*) [40])"// unimplemented SPV AMD gcn shader op ",
               (uint *)((long)&args_local + 4));
  }
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_gcn_shader_op(uint32_t result_type, uint32_t id, uint32_t eop, const uint32_t *args,
                                              uint32_t)
{
	require_extension_internal("GL_AMD_gcn_shader");

	enum AMDGCNShader
	{
		CubeFaceIndexAMD = 1,
		CubeFaceCoordAMD = 2,
		TimeAMD = 3
	};

	auto op = static_cast<AMDGCNShader>(eop);

	switch (op)
	{
	case CubeFaceIndexAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceIndexAMD");
		break;
	case CubeFaceCoordAMD:
		emit_unary_func_op(result_type, id, args[0], "cubeFaceCoordAMD");
		break;
	case TimeAMD:
	{
		string expr = "timeAMD()";
		emit_op(result_type, id, expr, true);
		register_control_dependent_expression(id);
		break;
	}

	default:
		statement("// unimplemented SPV AMD gcn shader op ", eop);
		break;
	}
}